

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O2

void __thiscall EventLoop::loop(EventLoop *this)

{
  byte bVar1;
  uint uVar2;
  pthread_t in_RAX;
  Logger *pLVar3;
  longlong lVar4;
  ulong in_RCX;
  ulong uVar5;
  nfds_t in_RDX;
  nfds_t extraout_RDX;
  char *in_RSI;
  id local_38;
  
  this->el_quit = false;
  bVar1 = 0;
  local_38._M_thread = in_RAX;
  while ((bVar1 & 1) == 0) {
    uVar2 = Epoll::poll((this->el_epoller).super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(pollfd *)in_RSI,in_RDX,(int)in_RCX);
    uVar5 = (ulong)uVar2;
    pLVar3 = Logger::get_instance();
    if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
      in_RSI = "error";
      in_RCX = 0x3e;
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","loop");
    }
    if (1 < (int)g_log_level) {
      pLVar3 = Logger::get_instance();
      local_38._M_thread = pthread_self();
      lVar4 = tid_to_ll(&local_38);
      in_RSI = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
      ;
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                        ,"loop",0x3e,LOG_LEVEL_INFO,
                        "eventloop, tid %lld, loop once, epoll event cnt %d\n",lVar4);
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
      in_RCX = uVar5;
    }
    execute_task_funcs(this);
    in_RDX = extraout_RDX;
    bVar1 = this->el_quit;
  }
  return;
}

Assistant:

void EventLoop::loop() {
    el_quit = false;
    while (!el_quit) {
        auto cnt = el_epoller->poll();
LOG_INFO("eventloop, tid %lld, loop once, epoll event cnt %d\n", tid_to_ll(this_thread::get_id()), cnt);
        execute_task_funcs();
    }
}